

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O2

VMEMcache *
bench_init(char *path,size_t size,size_t extent_size,vmemcache_repl_p repl_p,uint n_threads,
          context *ctx)

{
  FILE *__stream;
  int iVar1;
  VMEMcache *pVVar2;
  undefined8 uVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  
  pVVar2 = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(pVVar2,size);
  vmemcache_set_eviction_policy(pVVar2,1);
  iVar1 = vmemcache_add(pVVar2,path);
  if (iVar1 == 0) {
    for (lVar4 = 0; (extent_size & 0xffffffff) * 0x30 - lVar4 != 0; lVar4 = lVar4 + 0x30) {
      *(VMEMcache **)(CONCAT44(in_register_0000000c,repl_p) + 8 + lVar4) = pVVar2;
      *(undefined8 *)(CONCAT44(in_register_0000000c,repl_p) + 0x20 + lVar4) = 0;
    }
    return pVVar2;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_micro.c"
          ,0x35,"bench_init");
  __stream = _stderr;
  uVar3 = vmemcache_errormsg();
  fprintf(__stream,"vmemcache_add: %s (%s)",uVar3,path);
  fputc(10,_stderr);
  abort();
}

Assistant:

static VMEMcache *
bench_init(const char *path, size_t size, size_t extent_size,
		enum vmemcache_repl_p repl_p,
		unsigned n_threads, struct context *ctx)
{
	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, size);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, path))
		UT_FATAL("vmemcache_add: %s (%s)", vmemcache_errormsg(), path);

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].cache = cache;
		ctx[i].secs = 0.0;
	}

	return cache;
}